

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.h
# Opt level: O0

unsigned_long
(anonymous_namespace)::lexical_cast<unsigned_long,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg)

{
  byte bVar1;
  ostream *poVar2;
  long *plVar3;
  unsigned_long *puVar4;
  string *in_RDI;
  scoped_ptr<unsigned_long> r;
  unsigned_long result;
  stringstream interpreter;
  undefined7 in_stack_fffffffffffffe00;
  byte in_stack_fffffffffffffe07;
  scoped_ptr<unsigned_long> local_1c0 [2];
  unsigned_long local_1a0;
  stringstream local_198 [16];
  ostream local_188 [384];
  unsigned_long local_8;
  
  std::__cxx11::stringstream::stringstream(local_198);
  poVar2 = std::operator<<(local_188,in_RDI);
  bVar1 = std::ios::operator!((ios *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18)));
  if ((bVar1 & 1) == 0) {
    plVar3 = (long *)std::istream::operator>>(local_198,&local_1a0);
    bVar1 = std::ios::operator!((ios *)((long)plVar3 + *(long *)(*plVar3 + -0x18)));
    if ((bVar1 & 1) == 0) {
      std::istream::operator>>(local_198,std::ws<char,std::char_traits<char>>);
      in_stack_fffffffffffffe07 = std::ios::eof();
      if ((in_stack_fffffffffffffe07 & 1) != 0) {
        local_8 = local_1a0;
        goto LAB_00131190;
      }
    }
  }
  puVar4 = (unsigned_long *)operator_new(8);
  *puVar4 = 0;
  MeCab::scoped_ptr<unsigned_long>::scoped_ptr(local_1c0,puVar4);
  puVar4 = MeCab::scoped_ptr<unsigned_long>::operator*(local_1c0);
  local_8 = *puVar4;
  MeCab::scoped_ptr<unsigned_long>::~scoped_ptr
            ((scoped_ptr<unsigned_long> *)
             CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
LAB_00131190:
  std::__cxx11::stringstream::~stringstream(local_198);
  return local_8;
}

Assistant:

Target lexical_cast(Source arg) {
  std::stringstream interpreter;
  Target result;
  if (!(interpreter << arg) || !(interpreter >> result) ||
      !(interpreter >> std::ws).eof()) {
    MeCab::scoped_ptr<Target> r(new Target());  // return default value
    return *r;
  }
  return result;
}